

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

idx_t duckdb::BitStringAggOperation::GetRange<duckdb::hugeint_t>(hugeint_t min,hugeint_t max)

{
  hugeint_t hVar1;
  hugeint_t hVar2;
  bool bVar3;
  int64_t in_RCX;
  uint64_t in_RDX;
  int64_t in_RSI;
  uint64_t in_RDI;
  idx_t range;
  hugeint_t result;
  byte local_91;
  hugeint_t local_90;
  hugeint_t local_80;
  hugeint_t local_70;
  unsigned_long local_60 [5];
  hugeint_t local_38 [3];
  unsigned_long local_8;
  
  hVar2.upper = in_RCX;
  hVar2.lower = in_RDX;
  hVar1.upper = in_RSI;
  hVar1.lower = in_RDI;
  bVar3 = duckdb::TrySubtractOperator::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(hVar2,hVar1,local_38);
  if (bVar3) {
    duckdb::hugeint_t::hugeint_t(&local_80,1);
    local_70 = (hugeint_t)duckdb::hugeint_t::operator+(local_38,&local_80);
    bVar3 = duckdb::Hugeint::TryCast<unsigned_long>(local_70,local_60);
    local_91 = 1;
    if (bVar3) {
      local_90 = NumericLimits<duckdb::hugeint_t>::Maximum();
      local_91 = duckdb::hugeint_t::operator==(local_38,&local_90);
    }
    if ((local_91 & 1) == 0) {
      local_8 = local_60[0];
    }
    else {
      local_8 = NumericLimits<unsigned_long>::Maximum();
    }
  }
  else {
    local_8 = NumericLimits<unsigned_long>::Maximum();
  }
  return local_8;
}

Assistant:

idx_t BitStringAggOperation::GetRange(hugeint_t min, hugeint_t max) {
	hugeint_t result;
	if (!TrySubtractOperator::Operation(max, min, result)) {
		return NumericLimits<idx_t>::Maximum();
	}
	idx_t range;
	if (!Hugeint::TryCast(result + 1, range) || result == NumericLimits<hugeint_t>::Maximum()) {
		return NumericLimits<idx_t>::Maximum();
	}
	return range;
}